

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprCodeExprList(Parse *pParse,ExprList *pList,int target,int srcReg,u8 flags)

{
  Vdbe *p;
  Expr *p_00;
  byte bVar1;
  uint uVar2;
  int iVar3;
  VdbeOp *pVVar4;
  VdbeOp *pOp;
  int inReg;
  Expr *pExpr;
  Vdbe *v;
  u8 copyOp;
  int n;
  int j;
  int i;
  ExprList_item *pItem;
  u8 flags_local;
  int srcReg_local;
  int target_local;
  ExprList *pList_local;
  Parse *pParse_local;
  
  bVar1 = 0x55;
  if ((flags & 1) != 0) {
    bVar1 = 0x54;
  }
  p = pParse->pVdbe;
  v._4_4_ = pList->nExpr;
  pItem._7_1_ = flags;
  if (pParse->okConstFactor == '\0') {
    pItem._7_1_ = flags & 0xfd;
  }
  _j = pList->a;
  for (n = 0; n < v._4_4_; n = n + 1) {
    p_00 = _j->pExpr;
    if (((pItem._7_1_ & 4) == 0) || (uVar2 = (uint)(_j->u).x.iOrderByCol, uVar2 == 0)) {
      if (((pItem._7_1_ & 2) == 0) || (iVar3 = sqlite3ExprIsConstant(p_00), iVar3 == 0)) {
        iVar3 = sqlite3ExprCodeTarget(pParse,p_00,target + n);
        if (iVar3 != target + n) {
          if ((((bVar1 == 0x54) && (pVVar4 = sqlite3VdbeGetOp(p,-1), pVVar4->opcode == 'T')) &&
              (pVVar4->p1 + pVVar4->p3 + 1 == iVar3)) && (pVVar4->p2 + pVVar4->p3 + 1 == target + n)
             ) {
            pVVar4->p3 = pVVar4->p3 + 1;
          }
          else {
            sqlite3VdbeAddOp2(p,(uint)bVar1,iVar3,target + n);
          }
        }
      }
      else {
        sqlite3ExprCodeAtInit(pParse,p_00,target + n);
      }
    }
    else if ((pItem._7_1_ & 8) == 0) {
      sqlite3VdbeAddOp2(p,(uint)bVar1,uVar2 + srcReg + -1,target + n);
    }
    else {
      n = n + -1;
      v._4_4_ = v._4_4_ + -1;
    }
    _j = _j + 1;
  }
  return v._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeExprList(
  Parse *pParse,     /* Parsing context */
  ExprList *pList,   /* The expression list to be coded */
  int target,        /* Where to write results */
  int srcReg,        /* Source registers if SQLITE_ECEL_REF */
  u8 flags           /* SQLITE_ECEL_* flags */
){
  struct ExprList_item *pItem;
  int i, j, n;
  u8 copyOp = (flags & SQLITE_ECEL_DUP) ? OP_Copy : OP_SCopy;
  Vdbe *v = pParse->pVdbe;
  assert( pList!=0 );
  assert( target>0 );
  assert( pParse->pVdbe!=0 );  /* Never gets this far otherwise */
  n = pList->nExpr;
  if( !ConstFactorOk(pParse) ) flags &= ~SQLITE_ECEL_FACTOR;
  for(pItem=pList->a, i=0; i<n; i++, pItem++){
    Expr *pExpr = pItem->pExpr;
    if( (flags & SQLITE_ECEL_REF)!=0 && (j = pItem->u.x.iOrderByCol)>0 ){
      if( flags & SQLITE_ECEL_OMITREF ){
        i--;
        n--;
      }else{
        sqlite3VdbeAddOp2(v, copyOp, j+srcReg-1, target+i);
      }
    }else if( (flags & SQLITE_ECEL_FACTOR)!=0 && sqlite3ExprIsConstant(pExpr) ){
      sqlite3ExprCodeAtInit(pParse, pExpr, target+i);
    }else{
      int inReg = sqlite3ExprCodeTarget(pParse, pExpr, target+i);
      if( inReg!=target+i ){
        VdbeOp *pOp;
        if( copyOp==OP_Copy
         && (pOp=sqlite3VdbeGetOp(v, -1))->opcode==OP_Copy
         && pOp->p1+pOp->p3+1==inReg
         && pOp->p2+pOp->p3+1==target+i
        ){
          pOp->p3++;
        }else{
          sqlite3VdbeAddOp2(v, copyOp, inReg, target+i);
        }
      }
    }
  }
  return n;
}